

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AdditionGeneralizationImpl.hpp
# Opt level: O1

void __thiscall
Inferences::AdditionGeneralizationImpl::MonomSet<Kernel::NumTraits<Kernel::RealConstantType>_>::
MonomSet(MonomSet<Kernel::NumTraits<Kernel::RealConstantType>_> *this,Variable var,
        Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>
        *poly)

{
  Monom<Kernel::NumTraits<Kernel::RealConstantType>_> **ppMVar1;
  __mpz_struct *r;
  Polynom<Kernel::NumTraits<Kernel::RealConstantType>_> *pPVar2;
  Monom<Kernel::NumTraits<Kernel::RealConstantType>_> *pMVar3;
  long lVar4;
  Monom<Kernel::NumTraits<Kernel::RealConstantType>_> *monom;
  Monom<Kernel::NumTraits<Kernel::RealConstantType>_> *pMVar5;
  ulong uVar6;
  Monom<Kernel::NumTraits<Kernel::RealConstantType>_> local_90;
  MonomFactors<Kernel::NumTraits<Kernel::RealConstantType>_> *local_60;
  Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_> local_58;
  
  local_58._cursor = (Monom<Kernel::NumTraits<Kernel::RealConstantType>_> *)0x0;
  local_58._end = (Monom<Kernel::NumTraits<Kernel::RealConstantType>_> *)0x0;
  local_58._capacity = 0;
  local_58._stack = (Monom<Kernel::NumTraits<Kernel::RealConstantType>_> *)0x0;
  ::Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>::Stack
            (&this->_cancellable,&local_58);
  ::Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>::~Stack(&local_58);
  ::Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>::reserve
            (&this->_cancellable,
             (ulong)((int)((ulong)((long)(poly->_ptr->_summands)._cursor -
                                  (long)(poly->_ptr->_summands)._stack) >> 4) * -0x55555555 - 1));
  pPVar2 = poly->_ptr;
  pMVar5 = (pPVar2->_summands)._stack;
  pMVar3 = (pPVar2->_summands)._cursor;
  lVar4 = (long)pMVar3 - (long)pMVar5;
  if (pMVar5 != (Monom<Kernel::NumTraits<Kernel::RealConstantType>_> *)0x0 && lVar4 != 0) {
    uVar6 = (ulong)(pMVar3 != pMVar5);
    r = (__mpz_struct *)&local_90.numeral.super_RationalConstantType._num._val[0]._mp_d;
    do {
      Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>::tryVar(&local_90);
      if (((char)local_90.numeral.super_RationalConstantType._num._val[0]._mp_alloc == '\0') ||
         (((char)local_90.numeral.super_RationalConstantType._num._val[0]._mp_alloc != '\0' &&
          (local_90.numeral.super_RationalConstantType._num._val[0]._mp_size != var._num)))) {
        Kernel::RealConstantType::RealConstantType((RealConstantType *)r,&pMVar5->numeral);
        local_90.factors._ptr._0_4_ = (pMVar5->factors)._id;
        local_60 = (pMVar5->factors)._ptr;
        if ((this->_cancellable)._cursor == (this->_cancellable)._end) {
          ::Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>::expand
                    (&this->_cancellable);
        }
        pMVar5 = (this->_cancellable)._cursor;
        Kernel::RealConstantType::RealConstantType(&pMVar5->numeral,(RealConstantType *)r);
        (pMVar5->factors)._id = (uint)local_90.factors._ptr;
        (pMVar5->factors)._ptr = local_60;
        ppMVar1 = &(this->_cancellable)._cursor;
        *ppMVar1 = *ppMVar1 + 1;
        mpz_clear((__mpz_struct *)&local_90.numeral.super_RationalConstantType._den._val[0]._mp_d);
        mpz_clear(r);
      }
      if (uVar6 < (ulong)((lVar4 >> 4) * -0x5555555555555555)) {
        pMVar5 = (pPVar2->_summands)._stack + uVar6;
        uVar6 = uVar6 + 1;
      }
      else {
        pMVar5 = (Monom<Kernel::NumTraits<Kernel::RealConstantType>_> *)0x0;
      }
    } while (pMVar5 != (Monom<Kernel::NumTraits<Kernel::RealConstantType>_> *)0x0);
  }
  return;
}

Assistant:

MonomSet(Variable var, Perfect<Polynom<NumTraits>> poly) : MonomSet(decltype(_cancellable)()) 
  {
    _cancellable.reserve(poly->nSummands() - 1);
    for (auto const& monom : poly->iterSummands()) {
      if (monom.tryVar() != some(var)) {
        _cancellable.push(monom);
      }
    }
  }